

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IrLoader::AddInstruction(IrLoader *this,spv_parsed_instruction_t *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  Module *pMVar4;
  IRContext *pIVar5;
  pointer pIVar6;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *pvVar7;
  reference pvVar8;
  type __x;
  pointer pFVar9;
  UptrVectorIterator<spvtools::opt::Function,_false> *this_00;
  pointer this_01;
  pointer pBVar10;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_208
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_200
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1f8
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1f0
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1e8
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1e0
  ;
  uint32_t local_1d4;
  DebugInfoInstructions ext_inst_key_4;
  uint32_t local_1c4;
  NonSemanticShaderDebugInfo100Instructions ext_inst_key_3;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1b8
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1b0
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1a8
  ;
  uint32_t local_1a0;
  uint32_t local_19c;
  OpenCLDebugInfo100Instructions ext_inst_key_2;
  uint32_t ext_inst_index_1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_190
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_188
  ;
  undefined1 local_180 [8];
  iterator func_end;
  iterator func_begin;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_158
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_150
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_148
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_140
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_138
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_130
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_128
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_120
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_118
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_110
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_108
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_100
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_f8;
  spv_position_t local_f0;
  DebugScope local_d8;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_d0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_c8;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_c0;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> local_b8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_b0;
  unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> local_a8;
  undefined4 local_9c;
  undefined1 local_98 [8];
  spv_position_t loc;
  char *src;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_70;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_68;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> spv_inst;
  DebugScope local_58;
  uint32_t local_50;
  uint32_t local_4c;
  uint32_t inlined_at_1;
  DebugInfoInstructions ext_inst_key_1;
  DebugScope local_40;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t inlined_at;
  CommonDebugInfoInstructions ext_inst_key;
  uint32_t ext_inst_index;
  Op opcode;
  spv_parsed_instruction_t *local_20;
  spv_parsed_instruction_t *inst_local;
  IrLoader *this_local;
  
  this->inst_index_ = this->inst_index_ + 1;
  local_20 = inst;
  inst_local = (spv_parsed_instruction_t *)this;
  bVar1 = IsLineInst(inst);
  if (bVar1) {
    pMVar4 = module(this);
    Module::SetContainsDebugInfo(pMVar4);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    reset(&this->last_line_inst_,(pointer)0x0);
    pMVar4 = module(this);
    _ext_inst_index = Module::context(pMVar4);
    std::vector<spvtools::opt::Instruction,std::allocator<spvtools::opt::Instruction>>::
    emplace_back<spvtools::opt::IRContext*,spv_parsed_instruction_t_const&,spvtools::opt::DebugScope&>
              ((vector<spvtools::opt::Instruction,std::allocator<spvtools::opt::Instruction>> *)
               &this->dbg_line_info_,(IRContext **)&ext_inst_index,local_20,&this->last_dbg_scope_);
    this_local._7_1_ = 1;
    goto LAB_003da527;
  }
  ext_inst_key = (CommonDebugInfoInstructions)local_20->opcode;
  bVar1 = spvIsExtendedInstruction(ext_inst_key);
  if ((bVar1) && (bVar1 = spvExtInstIsDebugInfo(local_20->ext_inst_type), bVar1)) {
    inlined_at = local_20->words[4];
    if ((local_20->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) ||
       (local_20->ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)) {
      local_34 = inlined_at;
      if (inlined_at == 0x17) {
        local_38 = 0;
        if (6 < local_20->num_words) {
          local_38 = local_20->words[6];
        }
        DebugScope::DebugScope(&local_40,local_20->words[5],local_38);
        this->last_dbg_scope_ = local_40;
        pMVar4 = module(this);
        Module::SetContainsDebugInfo(pMVar4);
        this_local._7_1_ = 1;
        goto LAB_003da527;
      }
      if (inlined_at == 0x18) {
        DebugScope::DebugScope((DebugScope *)&inlined_at_1,0,0);
        this->last_dbg_scope_ = _inlined_at_1;
        pMVar4 = module(this);
        Module::SetContainsDebugInfo(pMVar4);
        this_local._7_1_ = 1;
        goto LAB_003da527;
      }
    }
    else {
      local_4c = inlined_at;
      if (inlined_at == 0x17) {
        local_50 = 0;
        if (6 < local_20->num_words) {
          local_50 = local_20->words[6];
        }
        DebugScope::DebugScope(&local_58,local_20->words[5],local_50);
        this->last_dbg_scope_ = local_58;
        pMVar4 = module(this);
        Module::SetContainsDebugInfo(pMVar4);
        this_local._7_1_ = 1;
        goto LAB_003da527;
      }
      if (inlined_at == 0x18) {
        DebugScope::DebugScope((DebugScope *)&spv_inst,0,0);
        this->last_dbg_scope_ =
             (DebugScope)
             spv_inst._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        pMVar4 = module(this);
        Module::SetContainsDebugInfo(pMVar4);
        this_local._7_1_ = 1;
        goto LAB_003da527;
      }
    }
  }
  pIVar3 = (Instruction *)operator_new(0x70);
  pMVar4 = module(this);
  pIVar5 = Module::context(pMVar4);
  Instruction::Instruction(pIVar3,pIVar5,local_20,&this->dbg_line_info_);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_68,pIVar3);
  pIVar6 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::operator->(&local_68);
  pvVar7 = Instruction::dbg_line_insts(pIVar6);
  bVar1 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
          empty(pvVar7);
  if (bVar1) {
    bVar1 = std::operator!=(&this->last_line_inst_,(nullptr_t)0x0);
    if (bVar1) {
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&this->last_line_inst_);
      Instruction::SetDebugScope(pIVar6,&this->last_dbg_scope_);
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&local_68);
      pvVar7 = Instruction::dbg_line_insts(pIVar6);
      __x = std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::operator*(&this->last_line_inst_);
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
      push_back(pvVar7,__x);
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&local_68);
      pvVar7 = Instruction::dbg_line_insts(pIVar6);
      pvVar8 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ::back(pvVar7);
      pMVar4 = module(this);
      pIVar5 = Module::context(pMVar4);
      pIVar3 = Instruction::Clone(pvVar8,pIVar5);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&src,pIVar3);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::operator=(&this->last_line_inst_,
                  (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   *)&src);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&src);
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&this->last_line_inst_);
      bVar1 = Instruction::IsDebugLineInst(pIVar6);
      if (bVar1) {
        pIVar6 = std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::operator->(&this->last_line_inst_);
        pMVar4 = module(this);
        pIVar5 = Module::context(pMVar4);
        uVar2 = IRContext::TakeNextId(pIVar5);
        Instruction::SetResultId(pIVar6,uVar2);
      }
    }
  }
  else {
    if ((this->extra_line_tracking_ & 1U) != 0) {
      pIVar6 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(&local_68);
      pvVar7 = Instruction::dbg_line_insts(pIVar6);
      pvVar8 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ::back(pvVar7);
      bVar1 = Instruction::IsNoLine(pvVar8);
      if (!bVar1) {
        pIVar6 = std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::operator->(&local_68);
        pvVar7 = Instruction::dbg_line_insts(pIVar6);
        pvVar8 = std::
                 vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
                 back(pvVar7);
        pMVar4 = module(this);
        pIVar5 = Module::context(pMVar4);
        pIVar3 = Instruction::Clone(pvVar8,pIVar5);
        std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
        ::unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                  ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                    *)&local_70,pIVar3);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        operator=(&this->last_line_inst_,&local_70);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr(&local_70);
        pIVar6 = std::
                 unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ::operator->(&this->last_line_inst_);
        bVar1 = Instruction::IsDebugLineInst(pIVar6);
        if (bVar1) {
          pIVar6 = std::
                   unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ::operator->(&this->last_line_inst_);
          pMVar4 = module(this);
          pIVar5 = Module::context(pMVar4);
          uVar2 = IRContext::TakeNextId(pIVar5);
          Instruction::SetResultId(pIVar6,uVar2);
        }
      }
    }
    std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::clear
              (&this->dbg_line_info_);
  }
  loc.index = std::__cxx11::string::c_str();
  local_98 = (undefined1  [8])(ulong)this->inst_index_;
  loc.line = 0;
  loc.column = 0;
  if (ext_inst_key == (CommonDebugInfoDebugMacroDef|CommonDebugInfoDebugLexicalBlockDiscriminator))
  {
    bVar1 = std::operator!=(&this->function_,(nullptr_t)0x0);
    if (!bVar1) {
      MakeUnique<spvtools::opt::Function,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((spvtools *)&local_a8,&local_68);
      std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
      operator=(&this->function_,&local_a8);
      std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
      ~unique_ptr(&local_a8);
      goto LAB_003da510;
    }
    Error(this->consumer_,(char *)loc.index,(spv_position_t *)local_98,"function inside function");
    this_local._7_1_ = 0;
  }
  else if (ext_inst_key == (CommonDebugInfoDebugMacroDef|CommonDebugInfoDebugNoScope)) {
    bVar1 = std::operator==(&this->function_,(nullptr_t)0x0);
    if (bVar1) {
      Error(this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
            "OpFunctionEnd without corresponding OpFunction");
      this_local._7_1_ = 0;
    }
    else {
      bVar1 = std::operator!=(&this->block_,(nullptr_t)0x0);
      if (!bVar1) {
        pFVar9 = std::
                 unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ::operator->(&this->function_);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        unique_ptr(&local_b0,&local_68);
        Function::SetFunctionEnd(pFVar9,&local_b0);
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr(&local_b0);
        pMVar4 = this->module_;
        std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
        unique_ptr(&local_b8,&this->function_);
        Module::AddFunction(pMVar4,&local_b8);
        std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
        ~unique_ptr(&local_b8);
        std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
        operator=(&this->function_,(nullptr_t)0x0);
        goto LAB_003da510;
      }
      Error(this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
            "OpFunctionEnd inside basic block");
      this_local._7_1_ = 0;
    }
  }
  else if (ext_inst_key == 0xf8) {
    bVar1 = std::operator==(&this->function_,(nullptr_t)0x0);
    if (bVar1) {
      Error(this->consumer_,(char *)loc.index,(spv_position_t *)local_98,"OpLabel outside function")
      ;
      this_local._7_1_ = 0;
    }
    else {
      bVar1 = std::operator!=(&this->block_,(nullptr_t)0x0);
      if (!bVar1) {
        MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                  ((spvtools *)&local_c0,&local_68);
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::operator=(&this->block_,&local_c0);
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::~unique_ptr(&local_c0);
        goto LAB_003da510;
      }
      Error(this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
            "OpLabel inside basic block");
      this_local._7_1_ = 0;
    }
  }
  else {
    bVar1 = spvOpcodeIsBlockTerminator(ext_inst_key);
    if (bVar1) {
      bVar1 = std::operator==(&this->function_,(nullptr_t)0x0);
      if (bVar1) {
        Error(this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
              "terminator instruction outside function");
        this_local._7_1_ = 0;
      }
      else {
        bVar1 = std::operator==(&this->block_,(nullptr_t)0x0);
        if (!bVar1) {
          uVar2 = DebugScope::GetLexicalScope(&this->last_dbg_scope_);
          if (uVar2 != 0) {
            pIVar6 = std::
                     unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ::operator->(&local_68);
            Instruction::SetDebugScope(pIVar6,&this->last_dbg_scope_);
          }
          pBVar10 = std::
                    unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ::operator->(&this->block_);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_c8,&local_68);
          BasicBlock::AddInstruction(pBVar10,&local_c8);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_c8);
          pFVar9 = std::
                   unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                   ::operator->(&this->function_);
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          unique_ptr(&local_d0,&this->block_);
          Function::AddBasicBlock(pFVar9,&local_d0);
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          ~unique_ptr(&local_d0);
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          operator=(&this->block_,(nullptr_t)0x0);
          DebugScope::DebugScope(&local_d8,0,0);
          this->last_dbg_scope_ = local_d8;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          reset(&this->last_line_inst_,(pointer)0x0);
          std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
          clear(&this->dbg_line_info_);
          goto LAB_003da510;
        }
        Error(this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
              "terminator instruction outside basic block");
        this_local._7_1_ = 0;
      }
    }
    else {
      bVar1 = std::operator==(&this->function_,(nullptr_t)0x0);
      if (bVar1) {
        bVar1 = std::operator==(&this->block_,(nullptr_t)0x0);
        if (!bVar1) {
          local_f0.line = 0xb7;
          local_f0.column = 0;
          local_f0.index = 0;
          Log(this->consumer_,SPV_MSG_INTERNAL_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_loader.cpp"
              ,&local_f0,"assertion failed: block_ == nullptr");
          exit(1);
        }
        if (ext_inst_key == CommonDebugInfoDebugTypeTemplateParameterPack) {
          pMVar4 = this->module_;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_f8,&local_68);
          Module::AddCapability(pMVar4,&local_f8);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_f8);
        }
        else if (ext_inst_key == CommonDebugInfoDebugTypeComposite) {
          pMVar4 = this->module_;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_100,&local_68);
          Module::AddExtension(pMVar4,&local_100);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_100);
        }
        else if (ext_inst_key == CommonDebugInfoDebugTypeMember) {
          pMVar4 = this->module_;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_108,&local_68);
          Module::AddExtInstImport(pMVar4,&local_108);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_108);
        }
        else if (ext_inst_key == CommonDebugInfoDebugTypeTemplate) {
          pMVar4 = this->module_;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_110,&local_68);
          Module::SetMemoryModel(pMVar4,&local_110);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_110);
        }
        else if (ext_inst_key == 0x1515) {
          pMVar4 = this->module_;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_118,&local_68);
          Module::SetSampledImageAddressMode(pMVar4,&local_118);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_118);
        }
        else if (ext_inst_key == CommonDebugInfoDebugTypeTemplateParameter) {
          pMVar4 = this->module_;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_120,&local_68);
          Module::AddEntryPoint(pMVar4,&local_120);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_120);
        }
        else if ((ext_inst_key == CommonDebugInfoDebugTypeTemplateTemplateParameter) ||
                (ext_inst_key == 0x14b)) {
          pMVar4 = this->module_;
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          unique_ptr(&local_128,&local_68);
          Module::AddExecutionMode(pMVar4,&local_128);
          std::
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
          ~unique_ptr(&local_128);
        }
        else {
          bVar1 = IsDebug1Inst(ext_inst_key);
          if (bVar1) {
            pMVar4 = this->module_;
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::unique_ptr(&local_130,&local_68);
            Module::AddDebug1Inst(pMVar4,&local_130);
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::~unique_ptr(&local_130);
          }
          else {
            bVar1 = IsDebug2Inst(ext_inst_key);
            if (bVar1) {
              pMVar4 = this->module_;
              std::
              unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ::unique_ptr(&local_138,&local_68);
              Module::AddDebug2Inst(pMVar4,&local_138);
              std::
              unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ::~unique_ptr(&local_138);
            }
            else {
              bVar1 = IsDebug3Inst(ext_inst_key);
              if (bVar1) {
                pMVar4 = this->module_;
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr(&local_140,&local_68);
                Module::AddDebug3Inst(pMVar4,&local_140);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr(&local_140);
              }
              else {
                bVar1 = IsAnnotationInst(ext_inst_key);
                if (bVar1) {
                  pMVar4 = this->module_;
                  std::
                  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ::unique_ptr(&local_148,&local_68);
                  Module::AddAnnotationInst(pMVar4,&local_148);
                  std::
                  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ::~unique_ptr(&local_148);
                }
                else {
                  bVar1 = IsTypeInst(ext_inst_key);
                  if (bVar1) {
                    pMVar4 = this->module_;
                    std::
                    unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ::unique_ptr(&local_150,&local_68);
                    Module::AddType(pMVar4,&local_150);
                    std::
                    unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ::~unique_ptr(&local_150);
                  }
                  else {
                    bVar1 = IsConstantInst(ext_inst_key);
                    if (((bVar1) ||
                        (ext_inst_key ==
                         (CommonDebugInfoDebugMacroDef|CommonDebugInfoDebugInlinedVariable))) ||
                       (ext_inst_key == CommonDebugInfoDebugCompilationUnit)) {
                      pMVar4 = this->module_;
                      std::
                      unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ::unique_ptr(&local_158,&local_68);
                      Module::AddGlobalValue(pMVar4,&local_158);
                      std::
                      unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ::~unique_ptr(&local_158);
                    }
                    else {
                      bVar1 = spvIsExtendedInstruction(ext_inst_key);
                      if ((bVar1) && (bVar1 = spvExtInstIsDebugInfo(local_20->ext_inst_type), bVar1)
                         ) {
                        pMVar4 = this->module_;
                        std::
                        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        ::unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                      *)&func_begin.iterator_,&local_68);
                        Module::AddExtInstDebugInfo
                                  (pMVar4,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                           *)&func_begin.iterator_);
                        std::
                        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                       *)&func_begin.iterator_);
                      }
                      else {
                        bVar1 = spvIsExtendedInstruction(ext_inst_key);
                        if ((!bVar1) ||
                           (bVar1 = spvExtInstIsNonSemantic(local_20->ext_inst_type), !bVar1)) {
                          Errorf<spv::Op_const&>
                                    (this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
                                     "Unhandled inst type (opcode: %d) found outside function definition."
                                     ,&ext_inst_key);
                          this_local._7_1_ = 0;
                          goto LAB_003da51e;
                        }
                        join_0x00000010_0x00000000_ = Module::begin(this->module_);
                        _local_180 = Module::end(this->module_);
                        bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator==
                                          ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                                           &func_end.iterator_,
                                           (UptrVectorIterator<spvtools::opt::Function,_false> *)
                                           local_180);
                        if (bVar1) {
                          pMVar4 = this->module_;
                          std::
                          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ::unique_ptr(&local_188,&local_68);
                          Module::AddGlobalValue(pMVar4,&local_188);
                          std::
                          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ::~unique_ptr(&local_188);
                        }
                        else {
                          this_00 = UptrVectorIterator<spvtools::opt::Function,_false>::operator--
                                              ((UptrVectorIterator<spvtools::opt::Function,_false> *
                                               )local_180);
                          this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator->
                                              (this_00);
                          std::
                          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ::unique_ptr(&local_190,&local_68);
                          Function::AddNonSemanticInstruction(this_01,&local_190);
                          std::
                          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ::~unique_ptr(&local_190);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        if ((ext_inst_key == 0xf6) || (ext_inst_key == 0xf7)) {
          DebugScope::DebugScope((DebugScope *)&ext_inst_key_2,0,0);
          this->last_dbg_scope_ = _ext_inst_key_2;
        }
        uVar2 = DebugScope::GetLexicalScope(&this->last_dbg_scope_);
        if (uVar2 != 0) {
          pIVar6 = std::
                   unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ::operator->(&local_68);
          Instruction::SetDebugScope(pIVar6,&this->last_dbg_scope_);
        }
        bVar1 = spvIsExtendedInstruction(ext_inst_key);
        if ((bVar1) && (bVar1 = spvExtInstIsDebugInfo(local_20->ext_inst_type), bVar1)) {
          local_19c = local_20->words[4];
          if (local_20->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
            local_1a0 = local_19c;
            if (local_19c == 0x1c) {
              bVar1 = std::operator==(&this->block_,(nullptr_t)0x0);
              if (bVar1) {
                pFVar9 = std::
                         unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                         ::operator->(&this->function_);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr(&local_1a8,&local_68);
                Function::AddDebugInstructionInHeader(pFVar9,&local_1a8);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr(&local_1a8);
              }
              else {
                pBVar10 = std::
                          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          ::operator->(&this->block_);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr(&local_1b0,&local_68);
                BasicBlock::AddInstruction(pBVar10,&local_1b0);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr(&local_1b0);
              }
            }
            else {
              if (local_19c != 0x1d) {
                Errorf<spv::Op_const&>
                          (this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
                           "Debug info extension instruction other than DebugScope, DebugNoScope, DebugFunctionDefinition, DebugDeclare, and DebugValue found inside function"
                           ,&ext_inst_key);
                this_local._7_1_ = 0;
                goto LAB_003da51e;
              }
              bVar1 = std::operator==(&this->block_,(nullptr_t)0x0);
              if (bVar1) {
                pFVar9 = std::
                         unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                         ::operator->(&this->function_);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr(&local_1b8,&local_68);
                Function::AddDebugInstructionInHeader(pFVar9,&local_1b8);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr(&local_1b8);
              }
              else {
                pBVar10 = std::
                          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          ::operator->(&this->block_);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              *)&stack0xfffffffffffffe40,&local_68);
                BasicBlock::AddInstruction
                          (pBVar10,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                    *)&stack0xfffffffffffffe40);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               *)&stack0xfffffffffffffe40);
              }
            }
          }
          else if (local_20->ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
            local_1c4 = local_19c;
            if (((1 < local_19c - 0x17) && (1 < local_19c - 0x1c)) && (local_19c != 0x65)) {
              Errorf<spv::Op_const&>
                        (this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
                         "Debug info extension instruction other than DebugScope, DebugNoScope, DebugDeclare, and DebugValue found inside function"
                         ,&ext_inst_key);
              this_local._7_1_ = 0;
              goto LAB_003da51e;
            }
            bVar1 = std::operator==(&this->block_,(nullptr_t)0x0);
            if (bVar1) {
              Errorf<spv::Op_const&>
                        (this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
                         "Debug info extension instruction found inside function but outside block",
                         &ext_inst_key);
            }
            else {
              pBVar10 = std::
                        unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        ::operator->(&this->block_);
              std::
              unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ::unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            *)&stack0xfffffffffffffe30,&local_68);
              BasicBlock::AddInstruction
                        (pBVar10,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                  *)&stack0xfffffffffffffe30);
              std::
              unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             *)&stack0xfffffffffffffe30);
            }
          }
          else {
            local_1d4 = local_19c;
            if (local_19c == 0x1c) {
              bVar1 = std::operator==(&this->block_,(nullptr_t)0x0);
              if (bVar1) {
                pFVar9 = std::
                         unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                         ::operator->(&this->function_);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr(&local_1e0,&local_68);
                Function::AddDebugInstructionInHeader(pFVar9,&local_1e0);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr(&local_1e0);
              }
              else {
                pBVar10 = std::
                          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          ::operator->(&this->block_);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr(&local_1e8,&local_68);
                BasicBlock::AddInstruction(pBVar10,&local_1e8);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr(&local_1e8);
              }
            }
            else {
              if (local_19c != 0x1d) {
                Errorf<spv::Op_const&>
                          (this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
                           "Debug info extension instruction other than DebugScope, DebugNoScope, DebugDeclare, and DebugValue found inside function"
                           ,&ext_inst_key);
                this_local._7_1_ = 0;
                goto LAB_003da51e;
              }
              bVar1 = std::operator==(&this->block_,(nullptr_t)0x0);
              if (bVar1) {
                pFVar9 = std::
                         unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                         ::operator->(&this->function_);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr(&local_1f0,&local_68);
                Function::AddDebugInstructionInHeader(pFVar9,&local_1f0);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr(&local_1f0);
              }
              else {
                pBVar10 = std::
                          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          ::operator->(&this->block_);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::unique_ptr(&local_1f8,&local_68);
                BasicBlock::AddInstruction(pBVar10,&local_1f8);
                std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::~unique_ptr(&local_1f8);
              }
            }
          }
        }
        else {
          bVar1 = std::operator==(&this->block_,(nullptr_t)0x0);
          if (bVar1) {
            if (ext_inst_key != (CommonDebugInfoDebugMacroDef|CommonDebugInfoDebugScope)) {
              Errorf<spv::Op_const&>
                        (this->consumer_,(char *)loc.index,(spv_position_t *)local_98,
                         "Non-OpFunctionParameter (opcode: %d) found inside function but outside basic block"
                         ,&ext_inst_key);
              this_local._7_1_ = 0;
              goto LAB_003da51e;
            }
            pFVar9 = std::
                     unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                     ::operator->(&this->function_);
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::unique_ptr(&local_200,&local_68);
            Function::AddParameter(pFVar9,&local_200);
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::~unique_ptr(&local_200);
          }
          else {
            pBVar10 = std::
                      unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      ::operator->(&this->block_);
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::unique_ptr(&local_208,&local_68);
            BasicBlock::AddInstruction(pBVar10,&local_208);
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::~unique_ptr(&local_208);
          }
        }
      }
LAB_003da510:
      this_local._7_1_ = 1;
    }
  }
LAB_003da51e:
  local_9c = 1;
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_68);
LAB_003da527:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IrLoader::AddInstruction(const spv_parsed_instruction_t* inst) {
  ++inst_index_;
  if (IsLineInst(inst)) {
    module()->SetContainsDebugInfo();
    last_line_inst_.reset();
    dbg_line_info_.emplace_back(module()->context(), *inst, last_dbg_scope_);
    return true;
  }

  // If it is a DebugScope or DebugNoScope of debug extension, we do not
  // create a new instruction, but simply keep the information in
  // struct DebugScope.
  const auto opcode = static_cast<spv::Op>(inst->opcode);
  if (spvIsExtendedInstruction(opcode) &&
      spvExtInstIsDebugInfo(inst->ext_inst_type)) {
    const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
    if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100 ||
        inst->ext_inst_type ==
            SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
      const CommonDebugInfoInstructions ext_inst_key =
          CommonDebugInfoInstructions(ext_inst_index);
      if (ext_inst_key == CommonDebugInfoDebugScope) {
        uint32_t inlined_at = 0;
        if (inst->num_words > kInlinedAtIndex)
          inlined_at = inst->words[kInlinedAtIndex];
        last_dbg_scope_ =
            DebugScope(inst->words[kLexicalScopeIndex], inlined_at);
        module()->SetContainsDebugInfo();
        return true;
      }
      if (ext_inst_key == CommonDebugInfoDebugNoScope) {
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
        module()->SetContainsDebugInfo();
        return true;
      }
    } else {
      const DebugInfoInstructions ext_inst_key =
          DebugInfoInstructions(ext_inst_index);
      if (ext_inst_key == DebugInfoDebugScope) {
        uint32_t inlined_at = 0;
        if (inst->num_words > kInlinedAtIndex)
          inlined_at = inst->words[kInlinedAtIndex];
        last_dbg_scope_ =
            DebugScope(inst->words[kLexicalScopeIndex], inlined_at);
        module()->SetContainsDebugInfo();
        return true;
      }
      if (ext_inst_key == DebugInfoDebugNoScope) {
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
        module()->SetContainsDebugInfo();
        return true;
      }
    }
  }

  std::unique_ptr<Instruction> spv_inst(
      new Instruction(module()->context(), *inst, std::move(dbg_line_info_)));
  if (!spv_inst->dbg_line_insts().empty()) {
    if (extra_line_tracking_ &&
        (!spv_inst->dbg_line_insts().back().IsNoLine())) {
      last_line_inst_ = std::unique_ptr<Instruction>(
          spv_inst->dbg_line_insts().back().Clone(module()->context()));
      if (last_line_inst_->IsDebugLineInst())
        last_line_inst_->SetResultId(module()->context()->TakeNextId());
    }
    dbg_line_info_.clear();
  } else if (last_line_inst_ != nullptr) {
    last_line_inst_->SetDebugScope(last_dbg_scope_);
    spv_inst->dbg_line_insts().push_back(*last_line_inst_);
    last_line_inst_ = std::unique_ptr<Instruction>(
        spv_inst->dbg_line_insts().back().Clone(module()->context()));
    if (last_line_inst_->IsDebugLineInst())
      last_line_inst_->SetResultId(module()->context()->TakeNextId());
  }

  const char* src = source_.c_str();
  spv_position_t loc = {inst_index_, 0, 0};

  // Handle function and basic block boundaries first, then normal
  // instructions.
  if (opcode == spv::Op::OpFunction) {
    if (function_ != nullptr) {
      Error(consumer_, src, loc, "function inside function");
      return false;
    }
    function_ = MakeUnique<Function>(std::move(spv_inst));
  } else if (opcode == spv::Op::OpFunctionEnd) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc,
            "OpFunctionEnd without corresponding OpFunction");
      return false;
    }
    if (block_ != nullptr) {
      Error(consumer_, src, loc, "OpFunctionEnd inside basic block");
      return false;
    }
    function_->SetFunctionEnd(std::move(spv_inst));
    module_->AddFunction(std::move(function_));
    function_ = nullptr;
  } else if (opcode == spv::Op::OpLabel) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc, "OpLabel outside function");
      return false;
    }
    if (block_ != nullptr) {
      Error(consumer_, src, loc, "OpLabel inside basic block");
      return false;
    }
    block_ = MakeUnique<BasicBlock>(std::move(spv_inst));
  } else if (spvOpcodeIsBlockTerminator(opcode)) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc, "terminator instruction outside function");
      return false;
    }
    if (block_ == nullptr) {
      Error(consumer_, src, loc, "terminator instruction outside basic block");
      return false;
    }
    if (last_dbg_scope_.GetLexicalScope() != kNoDebugScope)
      spv_inst->SetDebugScope(last_dbg_scope_);
    block_->AddInstruction(std::move(spv_inst));
    function_->AddBasicBlock(std::move(block_));
    block_ = nullptr;
    last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
    last_line_inst_.reset();
    dbg_line_info_.clear();
  } else {
    if (function_ == nullptr) {  // Outside function definition
      SPIRV_ASSERT(consumer_, block_ == nullptr);
      if (opcode == spv::Op::OpCapability) {
        module_->AddCapability(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExtension) {
        module_->AddExtension(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExtInstImport) {
        module_->AddExtInstImport(std::move(spv_inst));
      } else if (opcode == spv::Op::OpMemoryModel) {
        module_->SetMemoryModel(std::move(spv_inst));
      } else if (opcode == spv::Op::OpSamplerImageAddressingModeNV) {
        module_->SetSampledImageAddressMode(std::move(spv_inst));
      } else if (opcode == spv::Op::OpEntryPoint) {
        module_->AddEntryPoint(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExecutionMode ||
                 opcode == spv::Op::OpExecutionModeId) {
        module_->AddExecutionMode(std::move(spv_inst));
      } else if (IsDebug1Inst(opcode)) {
        module_->AddDebug1Inst(std::move(spv_inst));
      } else if (IsDebug2Inst(opcode)) {
        module_->AddDebug2Inst(std::move(spv_inst));
      } else if (IsDebug3Inst(opcode)) {
        module_->AddDebug3Inst(std::move(spv_inst));
      } else if (IsAnnotationInst(opcode)) {
        module_->AddAnnotationInst(std::move(spv_inst));
      } else if (IsTypeInst(opcode)) {
        module_->AddType(std::move(spv_inst));
      } else if (IsConstantInst(opcode) || opcode == spv::Op::OpVariable ||
                 opcode == spv::Op::OpUndef) {
        module_->AddGlobalValue(std::move(spv_inst));
      } else if (spvIsExtendedInstruction(opcode) &&
                 spvExtInstIsDebugInfo(inst->ext_inst_type)) {
        module_->AddExtInstDebugInfo(std::move(spv_inst));
      } else if (spvIsExtendedInstruction(opcode) &&
                 spvExtInstIsNonSemantic(inst->ext_inst_type)) {
        // If there are no functions, add the non-semantic instructions to the
        // global values. Otherwise append it to the list of the last function.
        auto func_begin = module_->begin();
        auto func_end = module_->end();
        if (func_begin == func_end) {
          module_->AddGlobalValue(std::move(spv_inst));
        } else {
          (--func_end)->AddNonSemanticInstruction(std::move(spv_inst));
        }
      } else {
        Errorf(consumer_, src, loc,
               "Unhandled inst type (opcode: %d) found outside function "
               "definition.",
               opcode);
        return false;
      }
    } else {
      if (opcode == spv::Op::OpLoopMerge || opcode == spv::Op::OpSelectionMerge)
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
      if (last_dbg_scope_.GetLexicalScope() != kNoDebugScope)
        spv_inst->SetDebugScope(last_dbg_scope_);
      if (spvIsExtendedInstruction(opcode) &&
          spvExtInstIsDebugInfo(inst->ext_inst_type)) {
        const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
        if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
          const OpenCLDebugInfo100Instructions ext_inst_key =
              OpenCLDebugInfo100Instructions(ext_inst_index);
          switch (ext_inst_key) {
            case OpenCLDebugInfo100DebugDeclare: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            case OpenCLDebugInfo100DebugValue: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugFunctionDefinition, DebugDeclare, and "
                     "DebugValue found inside function",
                     opcode);
              return false;
            }
          }
        } else if (inst->ext_inst_type ==
                   SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
          const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
              NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
          switch (ext_inst_key) {
            case NonSemanticShaderDebugInfo100DebugDeclare:
            case NonSemanticShaderDebugInfo100DebugValue:
            case NonSemanticShaderDebugInfo100DebugScope:
            case NonSemanticShaderDebugInfo100DebugNoScope:
            case NonSemanticShaderDebugInfo100DebugFunctionDefinition: {
              if (block_ == nullptr) {  // Inside function but outside blocks
                Errorf(consumer_, src, loc,
                       "Debug info extension instruction found inside function "
                       "but outside block",
                       opcode);
              } else {
                block_->AddInstruction(std::move(spv_inst));
              }
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugDeclare, and DebugValue found inside "
                     "function",
                     opcode);
              return false;
            }
          }
        } else {
          const DebugInfoInstructions ext_inst_key =
              DebugInfoInstructions(ext_inst_index);
          switch (ext_inst_key) {
            case DebugInfoDebugDeclare: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            case DebugInfoDebugValue: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugDeclare, and DebugValue found inside "
                     "function",
                     opcode);
              return false;
            }
          }
        }
      } else {
        if (block_ == nullptr) {  // Inside function but outside blocks
          if (opcode != spv::Op::OpFunctionParameter) {
            Errorf(consumer_, src, loc,
                   "Non-OpFunctionParameter (opcode: %d) found inside "
                   "function but outside basic block",
                   opcode);
            return false;
          }
          function_->AddParameter(std::move(spv_inst));
        } else {
          block_->AddInstruction(std::move(spv_inst));
        }
      }
    }
  }
  return true;
}